

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_select(jit_State *J,RecordFFData *rd)

{
  uint tr_00;
  int32_t iVar1;
  TRef TVar2;
  ulong uVar3;
  long local_38;
  ptrdiff_t i;
  ptrdiff_t n;
  ptrdiff_t start;
  TRef tr;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  tr_00 = *J->base;
  if (tr_00 != 0) {
    iVar1 = lj_ffrecord_select_mode(J,tr_00,rd->argv);
    n = (ptrdiff_t)iVar1;
    if (n == 0) {
      TVar2 = lj_ir_kint(J,J->maxslot - 1);
      *J->base = TVar2;
    }
    else if ((tr_00 & 0xffff) < 0x8000) {
      uVar3 = (ulong)J->maxslot;
      if (n < 0) {
        n = uVar3 + n;
      }
      else if ((long)uVar3 < n) {
        n = uVar3;
      }
      if (0 < n) {
        rd->nres = uVar3 - n;
        for (local_38 = 0; local_38 < (long)(uVar3 - n); local_38 = local_38 + 1) {
          J->base[local_38] = J->base[n + local_38];
        }
      }
    }
    else {
      recff_nyi(J,rd);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_select(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    ptrdiff_t start = lj_ffrecord_select_mode(J, tr, &rd->argv[0]);
    if (start == 0) {  /* select('#', ...) */
      J->base[0] = lj_ir_kint(J, J->maxslot - 1);
    } else if (tref_isk(tr)) {  /* select(k, ...) */
      ptrdiff_t n = (ptrdiff_t)J->maxslot;
      if (start < 0) start += n;
      else if (start > n) start = n;
      if (start >= 1) {
	ptrdiff_t i;
	rd->nres = n - start;
	for (i = 0; i < n - start; i++)
	  J->base[i] = J->base[start+i];
      }  /* else: Interpreter will throw. */
    } else {
      recff_nyiu(J, rd);
      return;
    }
  }  /* else: Interpreter will throw. */
}